

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.cpp
# Opt level: O0

void __thiscall merlin::bte::run(bte *this)

{
  ulong uVar1;
  bool bVar2;
  Type TVar3;
  _Setprecision _Var4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  undefined4 extraout_var;
  size_type sVar9;
  size_t sVar10;
  reference pvVar11;
  double dVar12;
  value vVar13;
  reference local_88;
  ulong local_78;
  vindex v_2;
  ulong local_68;
  vindex v_1;
  size_t local_58;
  size_t local_50;
  int local_44;
  ulong local_40;
  size_t k;
  variable VX;
  vindex v;
  bte *this_local;
  
  dVar12 = timeSystem();
  (this->super_algorithm).m_start_time = dVar12;
  (*(this->super_graphical_model)._vptr_graphical_model[0x10])();
  propagate(this);
  poVar7 = std::operator<<((ostream *)&std::cout,"[BTE] Finished in ");
  dVar12 = timeSystem();
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12 - (this->super_algorithm).m_start_time)
  ;
  poVar7 = std::operator<<(poVar7," seconds");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  TVar3 = Task::operator_cast_to_Type(&this->m_task);
  switch(TVar3) {
  case PR:
    poVar7 = std::operator<<((ostream *)&std::cout,"PR");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    _Var4 = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,_Var4);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_logz);
    poVar7 = std::operator<<(poVar7," (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::scientific);
    _Var4 = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,_Var4);
    dVar12 = exp(this->m_logz);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12);
    poVar7 = std::operator<<(poVar7,")");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    uVar5 = std::isinf(this->m_logz);
    if ((uVar5 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"STATUS");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"true: Consistent evidence");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"STATUS");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"false: Inconsistent evidence or underflow");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    break;
  case MAR:
    poVar7 = std::operator<<((ostream *)&std::cout,"PR");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    _Var4 = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,_Var4);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_logz);
    poVar7 = std::operator<<(poVar7," (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::scientific);
    _Var4 = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,_Var4);
    dVar12 = exp(this->m_logz);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12);
    poVar7 = std::operator<<(poVar7,")");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    uVar5 = std::isinf(this->m_logz);
    if ((uVar5 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"STATUS");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"true: Consistent evidence");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"STATUS");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cout,"false: Inconsistent evidence or underflow");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"MAR");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    sVar10 = graphical_model::nvar(&this->m_gmo);
    std::ostream::operator<<(&std::cout,sVar10);
    for (VX.m_states = 0; sVar10 = VX.m_states, sVar8 = graphical_model::nvar(&this->m_gmo),
        sVar10 < sVar8; VX.m_states = VX.m_states + 1) {
      _k = graphical_model::var(&this->m_gmo,VX.m_states);
      poVar7 = std::operator<<((ostream *)&std::cout," ");
      sVar10 = variable::states((variable *)&k);
      std::ostream::operator<<(poVar7,sVar10);
      for (local_40 = 0; uVar1 = local_40, sVar10 = variable::states((variable *)&k), uVar1 < sVar10
          ; local_40 = local_40 + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout," ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::fixed);
        local_44 = (int)std::setprecision(6);
        poVar7 = std::operator<<(poVar7,(_Setprecision)local_44);
        local_58 = k;
        local_50 = VX.m_label;
        iVar6 = (*(this->super_graphical_model)._vptr_graphical_model[0xb])(this,k,VX.m_label);
        vVar13 = factor::operator[]((factor *)CONCAT44(extraout_var,iVar6),local_40);
        std::ostream::operator<<(poVar7,vVar13);
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    break;
  case MAP:
    poVar7 = std::operator<<((ostream *)&std::cout,"Value");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    v_1._4_4_ = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,v_1._4_4_);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_logz);
    poVar7 = std::operator<<(poVar7," (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::scientific);
    v_1._0_4_ = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,v_1._0_4_);
    dVar12 = exp(this->m_logz);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12);
    poVar7 = std::operator<<(poVar7,")");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"MAP");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    sVar10 = graphical_model::nvar(&this->m_gmo);
    std::ostream::operator<<(&std::cout,sVar10);
    for (local_68 = 0; uVar1 = local_68, sVar10 = graphical_model::nvar(&this->m_gmo),
        uVar1 < sVar10; local_68 = local_68 + 1) {
      poVar7 = std::operator<<((ostream *)&std::cout," ");
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->m_best_config,local_68);
      std::ostream::operator<<(poVar7,*pvVar11);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    break;
  case MMAP:
    poVar7 = std::operator<<((ostream *)&std::cout,"Value");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    v_2._4_4_ = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,v_2._4_4_);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_logz);
    poVar7 = std::operator<<(poVar7," (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::scientific);
    v_2._0_4_ = std::setprecision(6);
    poVar7 = std::operator<<(poVar7,v_2._0_4_);
    dVar12 = exp(this->m_logz);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12);
    poVar7 = std::operator<<(poVar7,")");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"MMAP");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_query);
    std::ostream::operator<<(&std::cout,sVar9);
    for (local_78 = 0; uVar1 = local_78, sVar10 = graphical_model::nvar(&this->m_gmo),
        uVar1 < sVar10; local_78 = local_78 + 1) {
      local_88 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_var_types,local_78);
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_88);
      if (bVar2) {
        poVar7 = std::operator<<((ostream *)&std::cout," ");
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->m_best_config,local_78);
        std::ostream::operator<<(poVar7,*pvVar11);
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void bte::run() {

	// Start the timer and store it
	m_start_time = timeSystem();

	init();
	propagate();

	// Output solution (UAI output format)
	std::cout << "[BTE] Finished in " << (timeSystem() - m_start_time)
			<< " seconds" << std::endl;


	switch (m_task) {
	case Task::PR:	// partition function
		{
			std::cout << "PR" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			if (isinf(m_logz)) {
				std::cout << "STATUS" << std::endl;
				std::cout << "false: Inconsistent evidence or underflow" << std::endl;
			} else {
				std::cout << "STATUS" << std::endl;
				std::cout << "true: Consistent evidence" << std::endl;
			}

			break;
		}
	case Task::MAR:	// marginals
		{
			std::cout << "PR" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			if (isinf(m_logz)) {
				std::cout << "STATUS" << std::endl;
				std::cout << "false: Inconsistent evidence or underflow" << std::endl;
			} else {
				std::cout << "STATUS" << std::endl;
				std::cout << "true: Consistent evidence" << std::endl;
			}

			std::cout << "MAR" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				variable VX = m_gmo.var(v);
				std::cout << " " << VX.states();
				for (size_t k = 0; k < VX.states(); ++k) {
					std::cout << " " << std::fixed
						<< std::setprecision(MERLIN_PRECISION)
						<< belief(VX)[k];
				}
			}
			std::cout << std::endl;

			break;
		}
	case Task::MAP: // MAP inference
		{
			std::cout << "Value" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			std::cout << "MAP" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;

			break;
		}
	case Task::MMAP: // Marginal MAP inference
		{
			std::cout << "Value" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			std::cout << "MMAP" << std::endl;
			std::cout << m_query.size();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				if (m_var_types[v] == true)
					std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;

			break;
		}
	}

}